

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialManager.cpp
# Opt level: O3

bool __thiscall
MT32Emu::PartialManager::abortFirstPolyPreferHeldWhereReserveExceeded
          (PartialManager *this,int minPart)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = -1;
  if (minPart != 8) {
    iVar4 = minPart;
  }
  if (iVar4 < 8) {
    iVar5 = 8;
    do {
      iVar2 = iVar5 + -1;
      if (iVar5 == 0) {
        iVar2 = 8;
      }
      uVar3 = Part::getActivePartialCount(this->parts[iVar2]);
      if ((this->numReservedPartialsForPart[iVar2] < uVar3) &&
         (bVar1 = Part::abortFirstPolyPreferHeld(this->parts[iVar2]), bVar1)) {
        return true;
      }
      iVar5 = iVar5 + -1;
    } while (iVar4 < iVar5);
  }
  return false;
}

Assistant:

bool PartialManager::abortFirstPolyPreferHeldWhereReserveExceeded(int minPart) {
	if (minPart == 8) {
		// Rhythm is highest priority
		minPart = -1;
	}
	for (int partNum = 7; partNum >= minPart; partNum--) {
		int usePartNum = partNum == -1 ? 8 : partNum;
		if (parts[usePartNum]->getActivePartialCount() > numReservedPartialsForPart[usePartNum]) {
			// This part has exceeded its reserved partial count.
			// If it has any polys, kill its first (preferably held) one and we're done.
			if (parts[usePartNum]->abortFirstPolyPreferHeld()) {
				return true;
			}
		}
	}
	return false;
}